

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketExtensions.h
# Opt level: O1

int __thiscall uWS::ExtensionsParser::getToken(ExtensionsParser *this,char **in,char *stop)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  pcVar5 = *in;
  while ((pcVar5 != stop && (iVar2 = isalnum((int)*pcVar5), iVar2 == 0))) {
    pcVar5 = pcVar5 + 1;
    *in = pcVar5;
  }
  pcVar5 = *in;
  iVar2 = 0;
  while( true ) {
    if (pcVar5 == stop) {
      return iVar2;
    }
    cVar1 = *pcVar5;
    iVar4 = (int)cVar1;
    iVar3 = isalnum(iVar4);
    if (((iVar3 == 0) && (cVar1 != '_')) && (cVar1 != '-')) break;
    if (iVar4 - 0x30U < 10) {
      if (iVar2 + 0x7fffU < 0xfffe) {
        iVar2 = iVar2 * 10 - (iVar4 - 0x30U);
      }
    }
    else {
      iVar2 = iVar2 + iVar4;
    }
    pcVar5 = pcVar5 + 1;
    *in = pcVar5;
  }
  return iVar2;
}

Assistant:

int getToken(const char *&in, const char *stop) {
        while (in != stop && !isalnum(*in)) {
            in++;
        }

        /* Don't care more than this for now */
        static_assert(SHRT_MIN > INT_MIN, "Integer overflow fix is invalid for this platform, report this as a bug!");

        int hashedToken = 0;
        while (in != stop && (isalnum(*in) || *in == '-' || *in == '_')) {
            if (isdigit(*in)) {
                /* This check is a quick and incorrect fix for integer overflow
                 * in oss-fuzz but we don't care as it doesn't matter either way */
                if (hashedToken > SHRT_MIN && hashedToken < SHRT_MAX) {
                    hashedToken = hashedToken * 10 - (*in - '0');
                }
            } else {
                hashedToken += *in;
            }
            in++;
        }
        return hashedToken;
    }